

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

Status ot::commissioner::persistent_storage::anon_unknown_0::MapStatus(Status aStatus)

{
  undefined1 local_9;
  Status aStatus_local;
  
  if (aStatus == kError) {
    local_9 = kError;
  }
  else if (aStatus == kSuccess) {
    local_9 = kSuccess;
  }
  else if (aStatus == kNotFound) {
    local_9 = kNotFound;
  }
  else {
    local_9 = kError;
  }
  return local_9;
}

Assistant:

Registry::Status MapStatus(PersistentStorage::Status aStatus)
{
    if (aStatus == PersistentStorage::Status::kError)
    {
        return Registry::Status::kError;
    }
    if (aStatus == PersistentStorage::Status::kSuccess)
    {
        return Registry::Status::kSuccess;
    }
    if (aStatus == PersistentStorage::Status::kNotFound)
    {
        return Registry::Status::kNotFound;
    }
    return Registry::Status::kError;
}